

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void groupConcatFinalize(sqlite3_context *context)

{
  StrAccum *p;
  
  if ((short)context->pMem->flags < 0) {
    p = (StrAccum *)context->pMem->z;
  }
  else {
    p = (StrAccum *)createAggContext(context,0);
  }
  if (p != (StrAccum *)0x0) {
    sqlite3ResultStrAccum(context,p);
    sqlite3_free(p[1].zText);
    return;
  }
  return;
}

Assistant:

static void groupConcatFinalize(sqlite3_context *context){
  GroupConcatCtx *pGCC
    = (GroupConcatCtx*)sqlite3_aggregate_context(context, 0);
  if( pGCC ){
    sqlite3ResultStrAccum(context, &pGCC->str);
#ifndef SQLITE_OMIT_WINDOWFUNC
    sqlite3_free(pGCC->pnSepLengths);
#endif
  }
}